

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int runcmdopt(lua_State *L,char *opt)

{
  int iVar1;
  char *pcVar2;
  char *p;
  char *pcStack_18;
  int narg;
  char *opt_local;
  lua_State *L_local;
  
  p._4_4_ = 0;
  if ((opt != (char *)0x0) && (pcStack_18 = opt, *opt != '\0')) {
    while( true ) {
      pcVar2 = strchr(pcStack_18,0x2c);
      p._4_4_ = p._4_4_ + 1;
      if (pcVar2 == (char *)0x0) break;
      if (pcVar2 == pcStack_18) {
        lua_pushnil(L);
      }
      else {
        lua_pushlstring(L,pcStack_18,(long)pcVar2 - (long)pcStack_18);
      }
      pcStack_18 = pcVar2 + 1;
    }
    if (*pcStack_18 == '\0') {
      lua_pushnil(L);
    }
    else {
      lua_pushstring(L,pcStack_18);
    }
  }
  iVar1 = lua_pcall(L,p._4_4_,0,0);
  iVar1 = report(L,iVar1);
  return iVar1;
}

Assistant:

static int runcmdopt(lua_State *L, const char *opt)
{
  int narg = 0;
  if (opt && *opt) {
    for (;;) {  /* Split arguments. */
      const char *p = strchr(opt, ',');
      narg++;
      if (!p) break;
      if (p == opt)
	lua_pushnil(L);
      else
	lua_pushlstring(L, opt, (size_t)(p - opt));
      opt = p + 1;
    }
    if (*opt)
      lua_pushstring(L, opt);
    else
      lua_pushnil(L);
  }
  return report(L, lua_pcall(L, narg, 0, 0));
}